

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void pushOntoSorter(Parse *pParse,SortCtx *pSort,Select *pSelect,int regData,int regOrigData,
                   int nData,int nPrefixReg)

{
  int p2;
  int iStart;
  int iVar1;
  Vdbe *v;
  int iVar2;
  int p1;
  int iVar3;
  int iVar4;
  int iVar5;
  VdbeOp *pVVar6;
  KeyInfo *pKVar7;
  int p1_00;
  char cVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  
  v = pParse->pVdbe;
  uVar9 = pSort->sortFlags & 1;
  p2 = pSort->pOrderBy->nExpr;
  iVar10 = (uVar9 ^ 1) + p2;
  iVar11 = nData + iVar10;
  iVar2 = pParse->nMem;
  iVar5 = iVar2 + 1;
  pParse->nMem = iVar5;
  iStart = pSort->nOBSat;
  if (nPrefixReg == 0) {
    iVar2 = iVar2 + 2;
    pParse->nMem = iVar11 + iVar5;
  }
  else {
    iVar2 = regData - iVar10;
  }
  if (pSelect->iOffset == 0) {
    p1 = pSelect->iLimit;
  }
  else {
    p1 = pSelect->iOffset + 1;
  }
  iVar3 = sqlite3VdbeMakeLabel(v);
  pSort->labelDone = iVar3;
  sqlite3ExprCodeExprList
            (pParse,pSort->pOrderBy,iVar2,regOrigData,(regOrigData != 0) * '\x04' + '\x01');
  cVar8 = (char)uVar9;
  if (cVar8 == '\0') {
    sqlite3VdbeAddOp2(v,0x72,pSort->iECursor,iVar2 + p2);
  }
  if (0 < nData && nPrefixReg == 0) {
    sqlite3ExprCodeMove(pParse,regData,iVar10 + iVar2,nData);
  }
  sqlite3VdbeAddOp3(v,99,iVar2 + iStart,iVar11 - iStart,iVar5);
  if (0 < iStart) {
    iVar10 = pSort->nOBSat;
    iVar3 = pParse->nMem + 1;
    pParse->nMem = pParse->nMem + iVar10;
    if (cVar8 == '\0') {
      iVar4 = p2 + iVar2;
      iVar1 = 0x16;
    }
    else {
      iVar4 = pSort->iECursor;
      iVar1 = 0x6e;
    }
    iVar4 = sqlite3VdbeAddOp1(v,iVar1,iVar4);
    sqlite3VdbeAddOp3(v,0x5e,iVar3,iVar2,pSort->nOBSat);
    if (pParse->db->mallocFailed != '\0') {
      return;
    }
    pVVar6 = sqlite3VdbeGetOp(v,pSort->addrSortIndex);
    pVVar6->p2 = iVar11 - iVar10;
    pKVar7 = (pVVar6->p4).pKeyInfo;
    memset(pKVar7->aSortOrder,0,(ulong)pKVar7->nField);
    sqlite3VdbeChangeP4(v,-1,(char *)pKVar7,-9);
    pKVar7 = keyInfoFromExprList(pParse,pSort->pOrderBy,iStart,pKVar7->nXField - 1);
    (pVVar6->p4).pKeyInfo = pKVar7;
    iVar1 = v->nOp;
    iVar10 = iVar1 + 1;
    sqlite3VdbeAddOp3(v,0x12,iVar10,0,iVar10);
    iVar10 = sqlite3VdbeMakeLabel(v);
    pSort->labelBkOut = iVar10;
    p1_00 = pParse->nMem + 1;
    pParse->nMem = p1_00;
    pSort->regReturn = p1_00;
    sqlite3VdbeAddOp2(v,0xe,p1_00,iVar10);
    sqlite3VdbeAddOp1(v,0x85,pSort->iECursor);
    if (p1 != 0) {
      sqlite3VdbeAddOp2(v,0x16,p1,pSort->labelDone);
    }
    sqlite3VdbeJumpHere(v,iVar4);
    sqlite3ExprCodeMove(pParse,iVar2,iVar3,pSort->nOBSat);
    sqlite3VdbeJumpHere(v,iVar1);
  }
  sqlite3VdbeAddOp4Int
            (v,0x7e - (pSort->sortFlags & 1),pSort->iECursor,iVar5,iVar2 + iStart,iVar11 - iStart);
  if (p1 == 0) {
    return;
  }
  iVar5 = sqlite3VdbeAddOp1(v,0x2f,p1);
  sqlite3VdbeAddOp1(v,0x21,pSort->iECursor);
  if (pSort->bOrderedInnerLoop == '\0') {
    iVar11 = 0;
  }
  else {
    iVar11 = pParse->nMem + 1;
    pParse->nMem = iVar11;
    sqlite3VdbeAddOp3(v,0x60,pSort->iECursor,p2,iVar11);
  }
  sqlite3VdbeAddOp1(v,0x76,pSort->iECursor);
  if (pSort->bOrderedInnerLoop != '\0') {
    sqlite3VdbeAddOp3(v,0x4e,iVar2 + p2,v->nOp + 2,iVar11);
    if (0 < (long)v->nOp) {
      v->aOp[(long)v->nOp + -1].p5 = 0x80;
    }
  }
  sqlite3VdbeJumpHere(v,iVar5);
  return;
}

Assistant:

static void pushOntoSorter(
  Parse *pParse,         /* Parser context */
  SortCtx *pSort,        /* Information about the ORDER BY clause */
  Select *pSelect,       /* The whole SELECT statement */
  int regData,           /* First register holding data to be sorted */
  int regOrigData,       /* First register holding data before packing */
  int nData,             /* Number of elements in the data array */
  int nPrefixReg         /* No. of reg prior to regData available for use */
){
  Vdbe *v = pParse->pVdbe;                         /* Stmt under construction */
  int bSeq = ((pSort->sortFlags & SORTFLAG_UseSorter)==0);
  int nExpr = pSort->pOrderBy->nExpr;              /* No. of ORDER BY terms */
  int nBase = nExpr + bSeq + nData;                /* Fields in sorter record */
  int regBase;                                     /* Regs for sorter record */
  int regRecord = ++pParse->nMem;                  /* Assembled sorter record */
  int nOBSat = pSort->nOBSat;                      /* ORDER BY terms to skip */
  int op;                            /* Opcode to add sorter record to sorter */
  int iLimit;                        /* LIMIT counter */

  assert( bSeq==0 || bSeq==1 );
  assert( nData==1 || regData==regOrigData || regOrigData==0 );
  if( nPrefixReg ){
    assert( nPrefixReg==nExpr+bSeq );
    regBase = regData - nExpr - bSeq;
  }else{
    regBase = pParse->nMem + 1;
    pParse->nMem += nBase;
  }
  assert( pSelect->iOffset==0 || pSelect->iLimit!=0 );
  iLimit = pSelect->iOffset ? pSelect->iOffset+1 : pSelect->iLimit;
  pSort->labelDone = sqlite3VdbeMakeLabel(v);
  sqlite3ExprCodeExprList(pParse, pSort->pOrderBy, regBase, regOrigData,
                          SQLITE_ECEL_DUP | (regOrigData? SQLITE_ECEL_REF : 0));
  if( bSeq ){
    sqlite3VdbeAddOp2(v, OP_Sequence, pSort->iECursor, regBase+nExpr);
  }
  if( nPrefixReg==0 && nData>0 ){
    sqlite3ExprCodeMove(pParse, regData, regBase+nExpr+bSeq, nData);
  }
  sqlite3VdbeAddOp3(v, OP_MakeRecord, regBase+nOBSat, nBase-nOBSat, regRecord);
  if( nOBSat>0 ){
    int regPrevKey;   /* The first nOBSat columns of the previous row */
    int addrFirst;    /* Address of the OP_IfNot opcode */
    int addrJmp;      /* Address of the OP_Jump opcode */
    VdbeOp *pOp;      /* Opcode that opens the sorter */
    int nKey;         /* Number of sorting key columns, including OP_Sequence */
    KeyInfo *pKI;     /* Original KeyInfo on the sorter table */

    regPrevKey = pParse->nMem+1;
    pParse->nMem += pSort->nOBSat;
    nKey = nExpr - pSort->nOBSat + bSeq;
    if( bSeq ){
      addrFirst = sqlite3VdbeAddOp1(v, OP_IfNot, regBase+nExpr); 
    }else{
      addrFirst = sqlite3VdbeAddOp1(v, OP_SequenceTest, pSort->iECursor);
    }
    VdbeCoverage(v);
    sqlite3VdbeAddOp3(v, OP_Compare, regPrevKey, regBase, pSort->nOBSat);
    pOp = sqlite3VdbeGetOp(v, pSort->addrSortIndex);
    if( pParse->db->mallocFailed ) return;
    pOp->p2 = nKey + nData;
    pKI = pOp->p4.pKeyInfo;
    memset(pKI->aSortOrder, 0, pKI->nField); /* Makes OP_Jump below testable */
    sqlite3VdbeChangeP4(v, -1, (char*)pKI, P4_KEYINFO);
    testcase( pKI->nXField>2 );
    pOp->p4.pKeyInfo = keyInfoFromExprList(pParse, pSort->pOrderBy, nOBSat,
                                           pKI->nXField-1);
    addrJmp = sqlite3VdbeCurrentAddr(v);
    sqlite3VdbeAddOp3(v, OP_Jump, addrJmp+1, 0, addrJmp+1); VdbeCoverage(v);
    pSort->labelBkOut = sqlite3VdbeMakeLabel(v);
    pSort->regReturn = ++pParse->nMem;
    sqlite3VdbeAddOp2(v, OP_Gosub, pSort->regReturn, pSort->labelBkOut);
    sqlite3VdbeAddOp1(v, OP_ResetSorter, pSort->iECursor);
    if( iLimit ){
      sqlite3VdbeAddOp2(v, OP_IfNot, iLimit, pSort->labelDone);
      VdbeCoverage(v);
    }
    sqlite3VdbeJumpHere(v, addrFirst);
    sqlite3ExprCodeMove(pParse, regBase, regPrevKey, pSort->nOBSat);
    sqlite3VdbeJumpHere(v, addrJmp);
  }
  if( pSort->sortFlags & SORTFLAG_UseSorter ){
    op = OP_SorterInsert;
  }else{
    op = OP_IdxInsert;
  }
  sqlite3VdbeAddOp4Int(v, op, pSort->iECursor, regRecord,
                       regBase+nOBSat, nBase-nOBSat);
  if( iLimit ){
    int addr;
    int r1 = 0;
    /* Fill the sorter until it contains LIMIT+OFFSET entries.  (The iLimit
    ** register is initialized with value of LIMIT+OFFSET.)  After the sorter
    ** fills up, delete the least entry in the sorter after each insert.
    ** Thus we never hold more than the LIMIT+OFFSET rows in memory at once */
    addr = sqlite3VdbeAddOp1(v, OP_IfNotZero, iLimit); VdbeCoverage(v);
    sqlite3VdbeAddOp1(v, OP_Last, pSort->iECursor);
    if( pSort->bOrderedInnerLoop ){
      r1 = ++pParse->nMem;
      sqlite3VdbeAddOp3(v, OP_Column, pSort->iECursor, nExpr, r1);
      VdbeComment((v, "seq"));
    }
    sqlite3VdbeAddOp1(v, OP_Delete, pSort->iECursor);
    if( pSort->bOrderedInnerLoop ){
      /* If the inner loop is driven by an index such that values from
      ** the same iteration of the inner loop are in sorted order, then
      ** immediately jump to the next iteration of an inner loop if the
      ** entry from the current iteration does not fit into the top
      ** LIMIT+OFFSET entries of the sorter. */
      int iBrk = sqlite3VdbeCurrentAddr(v) + 2;
      sqlite3VdbeAddOp3(v, OP_Eq, regBase+nExpr, iBrk, r1);
      sqlite3VdbeChangeP5(v, SQLITE_NULLEQ);
      VdbeCoverage(v);
    }
    sqlite3VdbeJumpHere(v, addr);
  }
}